

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

uint32_t helper_testblock(CPUS390XState_conflict *env,uint64_t real_addr)

{
  uint64_t uVar1;
  ulong uVar2;
  uintptr_t unaff_retaddr;
  
  uVar1 = wrap_address(env,real_addr);
  for (uVar2 = 0; uVar2 < 0x1000; uVar2 = uVar2 + 8) {
    cpu_stq_mmuidx_ra_s390x(env,(uVar1 & 0xfffffffffffff000) + uVar2,0,3,unaff_retaddr);
  }
  return 0;
}

Assistant:

uint32_t HELPER(testblock)(CPUS390XState *env, uint64_t real_addr)
{
    uintptr_t ra = GETPC();
    int i;

    real_addr = wrap_address(env, real_addr) & TARGET_PAGE_MASK;

    for (i = 0; i < TARGET_PAGE_SIZE; i += 8) {
        cpu_stq_mmuidx_ra(env, real_addr + i, 0, MMU_REAL_IDX, ra);
    }

    return 0;
}